

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void __thiscall PDA::Transducer::Generator::writeGlobalFunctions(Generator *this,wostream *stream)

{
  bool bVar1;
  vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_> *this_00;
  wostream *pwVar2;
  wstring local_58;
  reference local_38;
  Identifier *id;
  const_iterator __end2;
  const_iterator __begin2;
  vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_> *__range2;
  wostream *stream_local;
  Generator *this_local;
  
  this_00 = Tokenizer::identifiers(this->m_tokenizer);
  __end2 = std::vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>::
           begin(this_00);
  id = (Identifier *)
       std::vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>::end
                 (this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_PDA::Transducer::Identifier_*,_std::vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>_>
                                *)&id);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<const_PDA::Transducer::Identifier_*,_std::vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>_>
               ::operator*(&__end2);
    if (local_38->type == Function) {
      pwVar2 = std::operator<<(stream,L".globl ");
      hash(&local_58,&local_38->decoratedName);
      pwVar2 = std::operator<<(pwVar2,(wstring *)&local_58);
      std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
      std::__cxx11::wstring::~wstring((wstring *)&local_58);
    }
    __gnu_cxx::
    __normal_iterator<const_PDA::Transducer::Identifier_*,_std::vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void Generator::writeGlobalFunctions(std::wostream &stream)
{
    for(const Identifier &id : m_tokenizer.identifiers())
    {
        if (id.type == Identifier::Type::Function)
        {
            stream << L".globl " << hash(id.decoratedName) << std::endl;
        }
    }
}